

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetImageData>::detach_helper
          (QSharedDataPointer<QStyleSheetImageData> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QStyleSheetImageData *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QStyleSheetImageData> *in_RDI;
  void *in_R8;
  QStyleSheetImageData *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x4664eb);
  Qt::totally_ordered_wrapper<QStyleSheetImageData_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x4664fd);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QStyleSheetImageData_*>::get(&in_RDI->d),
     pQVar3 != (QStyleSheetImageData *)0x0)) {
    QStyleSheetImageData::~QStyleSheetImageData((QStyleSheetImageData *)0x466520);
    operator_delete(pQVar3,0x20);
  }
  Qt::totally_ordered_wrapper<QStyleSheetImageData_*>::reset
            (&in_RDI->d,(QStyleSheetImageData *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}